

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lib_table.c
# Opt level: O0

int sort_comp(lua_State *L,int a,int b)

{
  int iVar1;
  undefined4 in_EDX;
  int in_ESI;
  lua_State *in_RDI;
  int res;
  int in_stack_ffffffffffffffd8;
  int in_stack_ffffffffffffffdc;
  undefined4 in_stack_ffffffffffffffe0;
  int in_stack_ffffffffffffffe4;
  undefined4 in_stack_fffffffffffffff8;
  undefined4 in_stack_fffffffffffffffc;
  
  iVar1 = lua_type((lua_State *)CONCAT44(in_ESI,in_EDX),in_stack_ffffffffffffffe4);
  if (iVar1 == 0) {
    iVar1 = lua_lessthan((lua_State *)CONCAT44(in_stack_fffffffffffffffc,in_stack_fffffffffffffff8),
                         (int)((ulong)in_RDI >> 0x20),(int)in_RDI);
  }
  else {
    lua_pushvalue(in_RDI,in_ESI);
    lua_pushvalue(in_RDI,in_ESI);
    lua_pushvalue(in_RDI,in_ESI);
    lua_call((lua_State *)CONCAT44(in_stack_ffffffffffffffe4,in_stack_ffffffffffffffe0),
             in_stack_ffffffffffffffdc,in_stack_ffffffffffffffd8);
    iVar1 = lua_toboolean((lua_State *)CONCAT44(in_stack_ffffffffffffffe4,in_stack_ffffffffffffffe0)
                          ,in_stack_ffffffffffffffdc);
    lua_settop((lua_State *)CONCAT44(iVar1,in_stack_ffffffffffffffe0),in_stack_ffffffffffffffdc);
  }
  return iVar1;
}

Assistant:

static int sort_comp(lua_State *L, int a, int b)
{
  if (!lua_isnil(L, 2)) {  /* function? */
    int res;
    lua_pushvalue(L, 2);
    lua_pushvalue(L, a-1);  /* -1 to compensate function */
    lua_pushvalue(L, b-2);  /* -2 to compensate function and `a' */
    lua_call(L, 2, 1);
    res = lua_toboolean(L, -1);
    lua_pop(L, 1);
    return res;
  } else {  /* a < b? */
    return lua_lessthan(L, a, b);
  }
}